

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase)

{
  long lVar1;
  fft_plan *pfVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 uStackY_58;
  fft_plan in_stack_ffffffffffffffb0;
  
  bVar4 = 0;
  pfVar2 = &minimum_phase->forward_fft;
  puVar3 = &uStackY_58;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)pfVar2;
    pfVar2 = (fft_plan *)&pfVar2->flags;
    puVar3 = puVar3 + 1;
  }
  fft_destroy_plan(in_stack_ffffffffffffffb0);
  pfVar2 = &minimum_phase->inverse_fft;
  puVar3 = &uStackY_58;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)pfVar2;
    pfVar2 = (fft_plan *)((long)pfVar2 + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  fft_destroy_plan(in_stack_ffffffffffffffb0);
  if (minimum_phase->cepstrum != (fft_complex *)0x0) {
    operator_delete__(minimum_phase->cepstrum);
  }
  if (minimum_phase->log_spectrum != (double *)0x0) {
    operator_delete__(minimum_phase->log_spectrum);
  }
  if (minimum_phase->minimum_phase_spectrum != (fft_complex *)0x0) {
    operator_delete__(minimum_phase->minimum_phase_spectrum);
    return;
  }
  return;
}

Assistant:

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase) {
  fft_destroy_plan(minimum_phase->forward_fft);
  fft_destroy_plan(minimum_phase->inverse_fft);
  delete[] minimum_phase->cepstrum;
  delete[] minimum_phase->log_spectrum;
  delete[] minimum_phase->minimum_phase_spectrum;
}